

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fundamental.cc
# Opt level: O3

double sfm::sampson_distance(FundamentalMatrix *F,Correspondence2D2D *m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double ret_2;
  double dVar6;
  double ret;
  double dVar7;
  double ret_1;
  double dVar8;
  
  dVar5 = m->p1[0];
  dVar1 = m->p1[1];
  dVar7 = dVar5 * F->m[0] + dVar1 * F->m[1] + F->m[2];
  dVar2 = m->p2[0];
  dVar3 = m->p2[1];
  dVar4 = dVar5 * F->m[3] + dVar1 * F->m[4] + F->m[5];
  dVar8 = F->m[0] * dVar2 + F->m[3] * dVar3 + F->m[6];
  dVar6 = F->m[1] * dVar2 + F->m[4] * dVar3 + F->m[7];
  dVar5 = dVar4 * dVar3 + dVar7 * dVar2 + 0.0 + dVar5 * F->m[6] + dVar1 * F->m[7] + F->m[8];
  return (dVar5 * dVar5) / (dVar6 * dVar6 + dVar8 * dVar8 + dVar4 * dVar4 + dVar7 * dVar7);
}

Assistant:

double
sampson_distance (FundamentalMatrix const& F, Correspondence2D2D const& m)
{
    /*
     * Computes the Sampson distance SD for a given match and fundamental
     * matrix. SD is computed as [Sect 11.4.3, Hartley, Zisserman]:
     *
     *   SD = (x'Fx)^2 / ( (Fx)_1^2 + (Fx)_2^2 + (x'F)_1^2 + (x'F)_2^2 )
     */

    double p2_F_p1 = 0.0;
    p2_F_p1 += m.p2[0] * (m.p1[0] * F[0] + m.p1[1] * F[1] + F[2]);
    p2_F_p1 += m.p2[1] * (m.p1[0] * F[3] + m.p1[1] * F[4] + F[5]);
    p2_F_p1 +=     1.0 * (m.p1[0] * F[6] + m.p1[1] * F[7] + F[8]);
    p2_F_p1 *= p2_F_p1;

    double sum = 0.0;
    sum += math::fastpow(m.p1[0] * F[0] + m.p1[1] * F[1] + F[2], 2);
    sum += math::fastpow(m.p1[0] * F[3] + m.p1[1] * F[4] + F[5], 2);
    sum += math::fastpow(m.p2[0] * F[0] + m.p2[1] * F[3] + F[6], 2);
    sum += math::fastpow(m.p2[0] * F[1] + m.p2[1] * F[4] + F[7], 2);

    return p2_F_p1 / sum;
}